

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::shortRangeInteractions(ForceManager *this)

{
  RealType *pRVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  InversionType *pIVar4;
  pointer ppAVar5;
  long lVar6;
  _Base_ptr p_Var7;
  Snapshot *this_00;
  double dVar8;
  Molecule *pMVar9;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  ulong uVar13;
  ulong uVar14;
  RigidBody *this_01;
  pointer ppRVar15;
  pointer ppBVar16;
  pointer ppBVar17;
  pointer ppTVar18;
  pointer ppIVar19;
  Bond *this_02;
  Inversion *pIVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  RealType angle;
  MoleculeIterator mi;
  double local_128;
  RealType local_120;
  InversionType *local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> local_f0;
  _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
  *local_c0;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *local_b8;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *local_b0;
  _Rb_tree_header *local_a8;
  MoleculeIterator local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  potVec local_68;
  
  local_a0._M_node = (_Base_ptr)0x0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  pMVar9 = SimInfo::beginMolecule(this->info_,&local_a0);
  if (pMVar9 == (Molecule *)0x0) {
    local_128 = 0.0;
    local_f8 = 0.0;
    local_100 = 0.0;
    local_108 = 0.0;
    local_110 = 0.0;
  }
  else {
    local_b0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                *)&this->bendDataSets;
    local_a8 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_b8 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                *)&this->torsionDataSets;
    p_Var2 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_c0 = (_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                *)&this->inversionDataSets;
    p_Var3 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_128 = 0.0;
    local_110 = 0.0;
    local_108 = 0.0;
    local_100 = 0.0;
    local_f8 = 0.0;
    do {
      ppRVar15 = (pMVar9->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppRVar15 ==
          (pMVar9->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (RigidBody *)0x0;
      }
      else {
        this_01 = *ppRVar15;
      }
      while (this_01 != (RigidBody *)0x0) {
        ppRVar15 = ppRVar15 + 1;
        RigidBody::updateAtoms(this_01);
        if (ppRVar15 ==
            (pMVar9->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          this_01 = (RigidBody *)0x0;
        }
        else {
          this_01 = *ppRVar15;
        }
      }
      ppBVar16 = (pMVar9->bonds_).
                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppBVar16 ==
          (pMVar9->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_02 = (Bond *)0x0;
      }
      else {
        this_02 = *ppBVar16;
      }
      while (this_02 != (Bond *)0x0) {
        ppBVar16 = ppBVar16 + 1;
        Bond::calcForce(this_02,this->doParticlePot_);
        pRVar1 = &this_02->potential_;
        if (this->doPotentialSelection_ == true) {
          ppAVar5 = (this_02->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = (ulong)((*ppAVar5)->super_StuntDouble).globalIndex_;
          uVar14 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar14 = uVar13;
          }
          lVar6 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                         (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar13 & 0x3f) & 1) == 0) {
            uVar13 = (ulong)(ppAVar5[1]->super_StuntDouble).globalIndex_;
            uVar14 = uVar13 + 0x3f;
            if (-1 < (long)uVar13) {
              uVar14 = uVar13;
            }
            if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                           (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar13 & 0x3f) & 1) == 0) goto LAB_00126f48;
          }
          local_128 = local_128 + *pRVar1;
        }
LAB_00126f48:
        if (ppBVar16 ==
            (pMVar9->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_02 = (Bond *)0x0;
        }
        else {
          this_02 = *ppBVar16;
        }
        local_110 = local_110 + *pRVar1;
      }
      ppBVar17 = (pMVar9->bends_).
                 super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppBVar17 ==
          (pMVar9->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pIVar20 = (Inversion *)0x0;
      }
      else {
        pIVar20 = (Inversion *)*ppBVar17;
      }
      while (pIVar20 != (Inversion *)0x0) {
        (*(pIVar20->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar20,&local_120,(ulong)this->doParticlePot_);
        p_Var10 = local_a8;
        for (p_Var7 = (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
            p_Var7 = (&p_Var7->_M_left)[*(Inversion **)(p_Var7 + 1) < pIVar20]) {
          if (*(Inversion **)(p_Var7 + 1) >= pIVar20) {
            p_Var10 = (_Rb_tree_header *)p_Var7;
          }
        }
        pIVar4 = pIVar20->inversionType_;
        uVar21 = SUB84(pIVar4,0);
        uVar22 = (undefined4)((ulong)pIVar4 >> 0x20);
        p_Var12 = local_a8;
        if ((p_Var10 != local_a8) &&
           (p_Var12 = p_Var10, pIVar20 < (Inversion *)p_Var10->_M_node_count)) {
          p_Var12 = local_a8;
        }
        if (p_Var12 == local_a8) {
          local_f0.second.deltaV = 0.0;
          local_f0.second.prev.angle = local_120;
          local_f0.second.curr.angle = local_120;
          local_118 = pIVar4;
          local_f0.first = pIVar20;
          local_f0.second.prev.potential = (RealType)pIVar4;
          local_f0.second.curr.potential = (RealType)pIVar4;
          std::
          _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                    (local_b0,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_f0);
          uVar21 = SUB84(local_118,0);
          uVar22 = (undefined4)((ulong)local_118 >> 0x20);
        }
        else {
          dVar8 = *(double *)((long)(p_Var12 + 1) + 0x20);
          *(undefined8 *)((long)(p_Var12 + 1) + 8) = *(undefined8 *)((long)(p_Var12 + 1) + 0x18);
          *(double *)((long)(p_Var12 + 1) + 0x10) = dVar8;
          *(RealType *)((long)(p_Var12 + 1) + 0x18) = local_120;
          *(InversionType **)((long)(p_Var12 + 1) + 0x20) = pIVar4;
          *(double *)(p_Var12 + 1) = ABS((double)pIVar4 - dVar8);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar5 = (pIVar20->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = (ulong)((*ppAVar5)->super_StuntDouble).globalIndex_;
          uVar14 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar14 = uVar13;
          }
          lVar6 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                         (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar13 & 0x3f) & 1) == 0) {
            uVar13 = (ulong)(ppAVar5[1]->super_StuntDouble).globalIndex_;
            uVar14 = uVar13 + 0x3f;
            if (-1 < (long)uVar13) {
              uVar14 = uVar13;
            }
            if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                           (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar13 & 0x3f) & 1) == 0) {
              uVar13 = (ulong)(ppAVar5[2]->super_StuntDouble).globalIndex_;
              uVar14 = uVar13 + 0x3f;
              if (-1 < (long)uVar13) {
                uVar14 = uVar13;
              }
              if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                             (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar13 & 0x3f) & 1) == 0) goto LAB_00127140;
            }
          }
          local_128 = local_128 + (double)pIVar20->inversionType_;
        }
LAB_00127140:
        ppBVar17 = ppBVar17 + 1;
        if (ppBVar17 ==
            (pMVar9->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pIVar20 = (Inversion *)0x0;
        }
        else {
          pIVar20 = (Inversion *)*ppBVar17;
        }
        local_108 = local_108 + (double)CONCAT44(uVar22,uVar21);
      }
      ppTVar18 = (pMVar9->torsions_).
                 super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppTVar18 ==
          (pMVar9->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar20 = (Inversion *)0x0;
      }
      else {
        pIVar20 = (Inversion *)*ppTVar18;
      }
      while (pIVar20 != (Inversion *)0x0) {
        (*(pIVar20->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar20,&local_120,(ulong)this->doParticlePot_);
        p_Var7 = (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var2->_M_header;
        for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
            p_Var7 = (&p_Var7->_M_left)[*(Inversion **)(p_Var7 + 1) < pIVar20]) {
          if (*(Inversion **)(p_Var7 + 1) >= pIVar20) {
            p_Var11 = p_Var7;
          }
        }
        pIVar4 = *(InversionType **)((long)&(pIVar20->name_).field_2 + 8);
        uVar21 = SUB84(pIVar4,0);
        uVar22 = (undefined4)((ulong)pIVar4 >> 0x20);
        p_Var10 = p_Var2;
        if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
           (p_Var10 = (_Rb_tree_header *)p_Var11,
           pIVar20 < (Inversion *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
          p_Var10 = p_Var2;
        }
        if (p_Var10 == p_Var2) {
          local_f0.second.deltaV = 0.0;
          local_f0.second.prev.angle = local_120;
          local_f0.second.curr.angle = local_120;
          local_118 = pIVar4;
          local_f0.first = pIVar20;
          local_f0.second.prev.potential = (RealType)pIVar4;
          local_f0.second.curr.potential = (RealType)pIVar4;
          std::
          _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                    (local_b8,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_f0);
          uVar21 = SUB84(local_118,0);
          uVar22 = (undefined4)((ulong)local_118 >> 0x20);
        }
        else {
          dVar8 = *(double *)((long)(p_Var10 + 1) + 0x20);
          *(undefined8 *)((long)(p_Var10 + 1) + 8) = *(undefined8 *)((long)(p_Var10 + 1) + 0x18);
          *(double *)((long)(p_Var10 + 1) + 0x10) = dVar8;
          *(RealType *)((long)(p_Var10 + 1) + 0x18) = local_120;
          *(InversionType **)((long)(p_Var10 + 1) + 0x20) = pIVar4;
          *(double *)(p_Var10 + 1) = ABS((double)pIVar4 - dVar8);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar5 = (pIVar20->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = (ulong)((*ppAVar5)->super_StuntDouble).globalIndex_;
          uVar14 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar14 = uVar13;
          }
          lVar6 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                         (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar13 & 0x3f) & 1) == 0) {
            uVar13 = (ulong)(ppAVar5[1]->super_StuntDouble).globalIndex_;
            uVar14 = uVar13 + 0x3f;
            if (-1 < (long)uVar13) {
              uVar14 = uVar13;
            }
            if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                           (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar13 & 0x3f) & 1) == 0) {
              uVar13 = (ulong)(ppAVar5[2]->super_StuntDouble).globalIndex_;
              uVar14 = uVar13 + 0x3f;
              if (-1 < (long)uVar13) {
                uVar14 = uVar13;
              }
              if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                             (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar13 & 0x3f) & 1) == 0) {
                uVar13 = (ulong)(ppAVar5[3]->super_StuntDouble).globalIndex_;
                uVar14 = uVar13 + 0x3f;
                if (-1 < (long)uVar13) {
                  uVar14 = uVar13;
                }
                if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                               (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar13 & 0x3f) & 1) == 0) goto LAB_00127370;
              }
            }
          }
          local_128 = local_128 + *(double *)((long)&(pIVar20->name_).field_2 + 8);
        }
LAB_00127370:
        ppTVar18 = ppTVar18 + 1;
        if (ppTVar18 ==
            (pMVar9->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pIVar20 = (Inversion *)0x0;
        }
        else {
          pIVar20 = (Inversion *)*ppTVar18;
        }
        local_100 = local_100 + (double)CONCAT44(uVar22,uVar21);
      }
      ppIVar19 = (pMVar9->inversions_).
                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppIVar19 ==
          (pMVar9->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar20 = (Inversion *)0x0;
      }
      else {
        pIVar20 = *ppIVar19;
      }
      while (pIVar20 != (Inversion *)0x0) {
        (*(pIVar20->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar20,&local_120,(ulong)this->doParticlePot_);
        p_Var7 = (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var3->_M_header;
        for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
            p_Var7 = (&p_Var7->_M_left)[*(Inversion **)(p_Var7 + 1) < pIVar20]) {
          if (*(Inversion **)(p_Var7 + 1) >= pIVar20) {
            p_Var11 = p_Var7;
          }
        }
        pIVar4 = (InversionType *)pIVar20->potential_;
        uVar21 = SUB84(pIVar4,0);
        uVar22 = (undefined4)((ulong)pIVar4 >> 0x20);
        p_Var10 = p_Var3;
        if (((_Rb_tree_header *)p_Var11 != p_Var3) &&
           (p_Var10 = (_Rb_tree_header *)p_Var11,
           pIVar20 < (Inversion *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
          p_Var10 = p_Var3;
        }
        if (p_Var10 == p_Var3) {
          local_f0.second.deltaV = 0.0;
          local_f0.second.prev.angle = local_120;
          local_f0.second.curr.angle = local_120;
          local_118 = pIVar4;
          local_f0.first = pIVar20;
          local_f0.second.prev.potential = (RealType)pIVar4;
          local_f0.second.curr.potential = (RealType)pIVar4;
          std::
          _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                    (local_c0,&local_f0);
          uVar21 = SUB84(local_118,0);
          uVar22 = (undefined4)((ulong)local_118 >> 0x20);
        }
        else {
          dVar8 = *(double *)((long)(p_Var10 + 1) + 0x20);
          *(undefined8 *)((long)(p_Var10 + 1) + 8) = *(undefined8 *)((long)(p_Var10 + 1) + 0x18);
          *(double *)((long)(p_Var10 + 1) + 0x10) = dVar8;
          *(RealType *)((long)(p_Var10 + 1) + 0x18) = local_120;
          *(InversionType **)((long)(p_Var10 + 1) + 0x20) = pIVar4;
          *(double *)(p_Var10 + 1) = ABS((double)pIVar4 - dVar8);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar5 = (pIVar20->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = (ulong)((*ppAVar5)->super_StuntDouble).globalIndex_;
          uVar14 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar14 = uVar13;
          }
          lVar6 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                         (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar13 & 0x3f) & 1) == 0) {
            uVar13 = (ulong)(ppAVar5[1]->super_StuntDouble).globalIndex_;
            uVar14 = uVar13 + 0x3f;
            if (-1 < (long)uVar13) {
              uVar14 = uVar13;
            }
            if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                           (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar13 & 0x3f) & 1) == 0) {
              uVar13 = (ulong)(ppAVar5[2]->super_StuntDouble).globalIndex_;
              uVar14 = uVar13 + 0x3f;
              if (-1 < (long)uVar13) {
                uVar14 = uVar13;
              }
              if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                             (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar13 & 0x3f) & 1) == 0) {
                uVar13 = (ulong)(ppAVar5[3]->super_StuntDouble).globalIndex_;
                uVar14 = uVar13 + 0x3f;
                if (-1 < (long)uVar13) {
                  uVar14 = uVar13;
                }
                if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                               (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar13 & 0x3f) & 1) == 0) goto LAB_001275a0;
              }
            }
          }
          local_128 = local_128 + pIVar20->potential_;
        }
LAB_001275a0:
        ppIVar19 = ppIVar19 + 1;
        if (ppIVar19 ==
            (pMVar9->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pIVar20 = (Inversion *)0x0;
        }
        else {
          pIVar20 = *ppIVar19;
        }
        local_f8 = local_f8 + (double)CONCAT44(uVar22,uVar21);
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_a0);
    } while (pMVar9 != (Molecule *)0x0);
  }
  this_00 = this->info_->sman_->currentSnapshot_;
  (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,this_00);
  Snapshot::setBondPotential(this_00,local_110);
  Snapshot::setBendPotential(this_00,local_108);
  Snapshot::setTorsionPotential(this_00,local_100);
  Snapshot::setInversionPotential(this_00,local_f8);
  local_68.data_[0] = local_98;
  local_68.data_[1] = dStack_90;
  local_68.data_[2] = local_88;
  local_68.data_[3] = dStack_80;
  local_68.data_[4] = local_78;
  local_68.data_[5] = dStack_70;
  local_68.data_[6] = local_128;
  Snapshot::setSelectionPotentials(this_00,&local_68);
  return;
}

Assistant:

void ForceManager::shortRangeInteractions() {
    Molecule* mol;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;

    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // calculate short range interactions
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->calcForce(doParticlePot_);
        bondPotential += bond->getPotential();
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bond->getAtomA()) ||
              seleMan_.isSelected(bond->getAtomB())) {
            selectionPotential[BONDED_FAMILY] += bond->getPotential();
          }
        }
      }

      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        RealType angle;
        bend->calcForce(angle, doParticlePot_);
        RealType currBendPot = bend->getPotential();

        bendPotential += bend->getPotential();
        map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
        if (i == bendDataSets.end()) {
          BendDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currBendPot;
          dataSet.deltaV                                  = 0.0;
          bendDataSets.insert(
              map<Bend*, BendDataSet>::value_type(bend, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currBendPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bend->getAtomA()) ||
              seleMan_.isSelected(bend->getAtomB()) ||
              seleMan_.isSelected(bend->getAtomC())) {
            selectionPotential[BONDED_FAMILY] += bend->getPotential();
          }
        }
      }

      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        RealType angle;
        torsion->calcForce(angle, doParticlePot_);
        RealType currTorsionPot = torsion->getPotential();
        torsionPotential += torsion->getPotential();
        map<Torsion*, TorsionDataSet>::iterator i =
            torsionDataSets.find(torsion);
        if (i == torsionDataSets.end()) {
          TorsionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
          dataSet.deltaV                                  = 0.0;
          torsionDataSets.insert(
              map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currTorsionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(torsion->getAtomA()) ||
              seleMan_.isSelected(torsion->getAtomB()) ||
              seleMan_.isSelected(torsion->getAtomC()) ||
              seleMan_.isSelected(torsion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += torsion->getPotential();
          }
        }
      }

      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        RealType angle;
        inversion->calcForce(angle, doParticlePot_);
        RealType currInversionPot = inversion->getPotential();
        inversionPotential += inversion->getPotential();
        map<Inversion*, InversionDataSet>::iterator i =
            inversionDataSets.find(inversion);
        if (i == inversionDataSets.end()) {
          InversionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
          dataSet.deltaV                                  = 0.0;
          inversionDataSets.insert(
              map<Inversion*, InversionDataSet>::value_type(inversion,
                                                            dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currInversionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(inversion->getAtomA()) ||
              seleMan_.isSelected(inversion->getAtomB()) ||
              seleMan_.isSelected(inversion->getAtomC()) ||
              seleMan_.isSelected(inversion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += inversion->getPotential();
          }
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }